

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint_mant.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    unsigned char mant[] = {
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33
    };
    _PDCLIB_bigint_t bigint;

    _PDCLIB_bigint_mant( &bigint, mant + 16, 1 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x01 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 2 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 3 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 4 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 5 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x13 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 6 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 7 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 8 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] >> ( _PDCLIB_BIGINT_DIGIT_BITS - _PDCLIB_CHAR_BIT ) == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 1 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x01 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 2 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 3 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 4 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 5 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x13 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 6 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 7 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 8 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );
#endif

    return TEST_RESULTS;
}